

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_test.cc
# Opt level: O2

void __thiscall
UnitTest_TestCryptoHmacSHA1_Test::UnitTest_TestCryptoHmacSHA1_Test
          (UnitTest_TestCryptoHmacSHA1_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0016e198;
  return;
}

Assistant:

TEST(UnitTest, TestCryptoHmacSHA1)
{
    Qiniu_Crypto_Init();
    const uint8_t testKey[] = {
        1, 2, 3
    };
    Qiniu_HMAC *hmac = Qiniu_HMAC_New(QINIU_DIGEST_TYPE_SHA1, testKey, sizeof(testKey));
    EXPECT_TRUE(hmac != NULL);

    const uint8_t testData[] = {
        1, 2, 3, 4, 5
    };
    const uint8_t expectedSHA1[] = {
        179,87,136,100,211,195,50,46,56,190,5,22,106,230,199,54,161,15,168,178
    };

    EXPECT_EQ(QINIU_CRYPTO_RESULT_OK, Qiniu_HMAC_Update(hmac, testData, sizeof(testData)));

    uint8_t actualSHA1[SHA_DIGEST_LENGTH];

    EXPECT_EQ(QINIU_CRYPTO_RESULT_OK, Qiniu_HMAC_Final(hmac, actualSHA1, NULL));
    
    EXPECT_EQ(0, memcmp(expectedSHA1, actualSHA1, SHA_DIGEST_LENGTH));

    Qiniu_HMAC_Free(hmac);
    Qiniu_Crypto_Cleanup();
}